

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int client_handle_encrypted_extensions
              (ptls_t *tls,ptls_iovec_t message,ptls_handshake_properties_t *properties)

{
  ushort uVar1;
  st_ptls_on_extension_t *psVar2;
  ptls_key_schedule_t *ppVar3;
  ushort *puVar4;
  byte bVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  ushort *puVar12;
  uint8_t *puVar13;
  ushort *puVar14;
  ushort *puVar15;
  ushort *end;
  ushort type;
  ptls_hash_context_t **pppVar16;
  ushort *puVar17;
  size_t sVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  ptls_iovec_t pVar22;
  ptls_raw_extension_t unknown_extensions [17];
  ushort *local_218;
  byte local_1f0 [12];
  int local_1e4;
  uint8_t *local_1e0;
  ulong local_1d8;
  ptls_t *local_1d0;
  ptls_raw_extension_t local_1c8 [17];
  
  uVar11 = message.len;
  puVar13 = message.base;
  end = (ushort *)(puVar13 + 4);
  local_1c8[0].type = 0xffff;
  local_1f0[0] = 0x20;
  local_1f0[1] = 0x20;
  local_1f0[2] = 0;
  local_1f0[3] = 0;
  local_1f0[4] = 0;
  local_1f0[5] = 0x3a;
  local_1f0[6] = 8;
  local_1f0[7] = 0;
  uVar8 = 0x32;
  if ((uVar11 & 0xfffffffffffffffe) != 4) {
    lVar10 = 0;
    uVar9 = 0;
    do {
      uVar9 = (ulong)*(byte *)((long)end + lVar10) | uVar9 << 8;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 2);
    end = (ushort *)(puVar13 + 6);
    if (uVar9 <= uVar11 - 6) {
      bVar19 = uVar9 == 0;
      if (bVar19) {
        bVar21 = false;
        puVar14 = (ushort *)0x0;
      }
      else {
        puVar17 = (ushort *)(puVar13 + uVar9 + 6);
        local_1e4 = 1;
        puVar14 = (ushort *)0x0;
        local_1d0 = tls;
        local_1d8 = uVar11;
        local_1e0 = puVar13;
        puVar15 = end;
        while (uVar8 = 0x32, end = puVar15, 1 < (long)puVar17 - (long)puVar15) {
          uVar1 = *puVar15;
          type = uVar1 << 8 | uVar1 >> 8;
          end = puVar15 + 1;
          if (type < 0x40) {
            if ((local_1f0[type >> 3] >> (type & 7) & 1) != 0) {
              uVar8 = 0x2f;
              break;
            }
            if (type < 0x40) {
              local_1f0[type >> 3] = local_1f0[type >> 3] | (byte)(1 << ((byte)(uVar1 >> 8) & 7));
            }
          }
          uVar8 = 0x32;
          if ((ulong)((long)puVar17 - (long)end) < 2) {
            bVar21 = false;
          }
          else {
            lVar10 = 0;
            uVar9 = 0;
            do {
              uVar9 = (ulong)*(byte *)((long)end + lVar10) | uVar9 << 8;
              lVar10 = lVar10 + 1;
            } while (lVar10 != 2);
            local_218 = puVar15 + 2;
            uVar6 = 0;
            if ((ulong)((long)puVar17 - (long)local_218) < uVar9) {
LAB_0011c22c:
              bVar21 = false;
              end = local_218;
            }
            else {
              psVar2 = tls->ctx->on_extension;
              if (psVar2 != (st_ptls_on_extension_t *)0x0) {
                pVar22.len = uVar9;
                pVar22.base = (uint8_t *)local_218;
                iVar7 = (*psVar2->cb)(psVar2,tls,'\b',type,pVar22);
                bVar21 = iVar7 != 0;
                uVar6 = (uint)bVar21;
                tls = local_1d0;
                uVar11 = local_1d8;
                puVar13 = local_1e0;
                if (bVar21) {
                  uVar8 = (uint)bVar21;
                  goto LAB_0011c22c;
                }
              }
              end = (ushort *)((long)end + uVar9 + 2);
              puVar4 = puVar14;
              if (type < 0x2a) {
                if (type == 0) {
                  if (uVar9 == 0) {
                    uVar8 = 0x2f;
                    if ((tls->server_name != (char *)0x0) &&
                       (iVar7 = ptls_server_name_is_ipaddr(tls->server_name), iVar7 == 0))
                    goto LAB_0011c263;
                  }
                  goto LAB_0011c22c;
                }
                if (type != 0x10) {
LAB_0011c113:
                  handle_unknown_extension
                            (tls,properties,type,(uint8_t *)local_218,(uint8_t *)end,local_1c8);
                  goto LAB_0011c263;
                }
                bVar21 = true;
                uVar8 = 0x32;
                if (1 < uVar9) {
                  lVar10 = 0;
                  uVar9 = 0;
                  do {
                    uVar9 = (ulong)*(byte *)((long)puVar15 + lVar10 + 4) | uVar9 << 8;
                    lVar10 = lVar10 + 1;
                  } while (lVar10 != 2);
                  local_218 = puVar15 + 3;
                  bVar21 = true;
                  if (uVar9 <= (ulong)((long)end - (long)local_218)) {
                    puVar12 = (ushort *)((long)local_218 + uVar9);
                    bVar21 = true;
                    uVar8 = 0x32;
                    if (uVar9 == 0) {
                      bVar20 = false;
                    }
                    else {
                      uVar9 = (ulong)(byte)puVar15[3];
                      puVar15 = (ushort *)((long)puVar15 + 7);
                      if (((ulong)((long)puVar12 - (long)puVar15) < uVar9) || (uVar9 == 0)) {
                        bVar20 = false;
                        local_218 = puVar15;
                      }
                      else {
                        local_218 = (ushort *)((long)local_218 + uVar9 + 1);
                        uVar6 = ptls_set_negotiated_protocol
                                          (tls,(char *)puVar15,(long)local_218 - (long)puVar15);
                        uVar8 = 0;
                        bVar20 = uVar6 == 0;
                        if (!bVar20) {
                          uVar8 = uVar6;
                          local_218 = puVar15;
                        }
                        bVar21 = !bVar20;
                        tls = local_1d0;
                        uVar11 = local_1d8;
                        puVar13 = local_1e0;
                      }
                    }
                    if ((bVar20) && (bVar21 = local_218 != puVar12, bVar21)) {
                      uVar8 = 0x28;
                    }
                  }
                }
                if (bVar21) {
                  bVar21 = false;
                  end = local_218;
                }
                else {
                  uVar6 = uVar8;
                  if (local_218 == end) goto LAB_0011c263;
                  uVar8 = 0x32;
                  bVar21 = false;
                  end = local_218;
                }
              }
              else {
                if (type == 0x2a) {
                  if (((tls->field_20).server.pending_traffic_secret[0x28] & 2) == 0) {
                    uVar8 = 0x2f;
                    goto LAB_0011c22c;
                  }
                  local_1e4 = 0;
                }
                else {
                  if (type != 0xffce) goto LAB_0011c113;
                  puVar4 = local_218;
                  if (uVar9 != 0x10) {
                    uVar8 = 0x2f;
                    goto LAB_0011c22c;
                  }
                }
LAB_0011c263:
                uVar8 = uVar6;
                puVar14 = puVar4;
                bVar21 = true;
              }
            }
          }
          if ((!bVar21) || (bVar19 = end == puVar17, puVar15 = end, bVar19)) break;
        }
        bVar21 = local_1e4 == 0;
      }
      goto LAB_0011bf07;
    }
  }
  bVar21 = false;
  puVar14 = (ushort *)0x0;
  bVar19 = false;
LAB_0011bf07:
  if ((bVar19) && (uVar8 = 0x32, end == (ushort *)(puVar13 + uVar11))) {
    if (tls->esni == (st_ptls_esni_secret_t *)0x0) {
      if (puVar14 != (ushort *)0x0) {
        return 0x2f;
      }
    }
    else {
      if (puVar14 == (ushort *)0x0) {
        return 0x2f;
      }
      iVar7 = (*ptls_mem_equal)(puVar14,tls->esni->nonce,0x10);
      if (iVar7 == 0) {
        return 0x2f;
      }
      free_esni_secret(&tls->esni,0);
    }
    bVar5 = (tls->field_20).server.pending_traffic_secret[0x28];
    if ((bVar5 & 2) != 0) {
      if (bVar21 == false) {
        (tls->field_20).server.pending_traffic_secret[0x28] = bVar5 & 0xfd;
      }
      if (properties != (ptls_handshake_properties_t *)0x0) {
        (properties->field_0).client.early_data_acceptance = bVar21 + PTLS_EARLY_DATA_REJECTED;
      }
    }
    uVar8 = report_unknown_extensions(tls,properties,local_1c8);
    if (uVar8 == 0) {
      ppVar3 = tls->key_schedule;
      if (ppVar3->num_hashes != 0) {
        pppVar16 = &ppVar3->hashes[0].ctx;
        sVar18 = 0;
        do {
          (*(*pppVar16)->update)(*pppVar16,puVar13,uVar11);
          sVar18 = sVar18 + 1;
          pppVar16 = pppVar16 + 2;
        } while (sVar18 != ppVar3->num_hashes);
      }
      bVar5 = (tls->field_0x160 & 2) >> 1;
      tls->state = (uint)bVar5 + (uint)bVar5 * 2 +
                   PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_REQUEST_OR_CERTIFICATE;
      uVar8 = 0x202;
    }
  }
  return uVar8;
}

Assistant:

static int client_handle_encrypted_extensions(ptls_t *tls, ptls_iovec_t message, ptls_handshake_properties_t *properties)
{
    const uint8_t *src = message.base + PTLS_HANDSHAKE_HEADER_SIZE, *const end = message.base + message.len, *esni = NULL;
    uint16_t type;
    ptls_raw_extension_t unknown_extensions[MAX_UNKNOWN_EXTENSIONS + 1];
    int ret, skip_early_data = 1;

    unknown_extensions[0].type = UINT16_MAX;

    decode_extensions(src, end, PTLS_HANDSHAKE_TYPE_ENCRYPTED_EXTENSIONS, &type, {
        if (tls->ctx->on_extension != NULL &&
            (ret = tls->ctx->on_extension->cb(tls->ctx->on_extension, tls, PTLS_HANDSHAKE_TYPE_ENCRYPTED_EXTENSIONS, type,
                                              ptls_iovec_init(src, end - src)) != 0))
            goto Exit;
        switch (type) {
        case PTLS_EXTENSION_TYPE_SERVER_NAME:
            if (src != end) {
                ret = PTLS_ALERT_DECODE_ERROR;
                goto Exit;
            }
            if (!(tls->server_name != NULL && !ptls_server_name_is_ipaddr(tls->server_name))) {
                ret = PTLS_ALERT_ILLEGAL_PARAMETER;
                goto Exit;
            }
            break;
        case PTLS_EXTENSION_TYPE_ENCRYPTED_SERVER_NAME:
            if (end - src != PTLS_ESNI_NONCE_SIZE) {
                ret = PTLS_ALERT_ILLEGAL_PARAMETER;
                goto Exit;
            }
            esni = src;
            break;
        case PTLS_EXTENSION_TYPE_ALPN:
            ptls_decode_block(src, end, 2, {
                ptls_decode_open_block(src, end, 1, {
                    if (src == end) {
                        ret = PTLS_ALERT_DECODE_ERROR;
                        goto Exit;
                    }
                    if ((ret = ptls_set_negotiated_protocol(tls, (const char *)src, end - src)) != 0)
                        goto Exit;
                    src = end;
                });
                if (src != end) {
                    ret = PTLS_ALERT_HANDSHAKE_FAILURE;
                    goto Exit;
                }
            });
            break;
        case PTLS_EXTENSION_TYPE_EARLY_DATA:
            if (!tls->client.using_early_data) {
                ret = PTLS_ALERT_ILLEGAL_PARAMETER;
                goto Exit;
            }
            skip_early_data = 0;
            break;
        default:
            handle_unknown_extension(tls, properties, type, src, end, unknown_extensions);
            break;
        }
        src = end;
    });

    if (tls->esni != NULL) {
        if (esni == NULL || !ptls_mem_equal(esni, tls->esni->nonce, PTLS_ESNI_NONCE_SIZE)) {
            ret = PTLS_ALERT_ILLEGAL_PARAMETER;
            goto Exit;
        }
        free_esni_secret(&tls->esni, 0);
    } else {
        if (esni != NULL) {
            ret = PTLS_ALERT_ILLEGAL_PARAMETER;
            goto Exit;
        }
    }

    if (tls->client.using_early_data) {
        if (skip_early_data)
            tls->client.using_early_data = 0;
        if (properties != NULL)
            properties->client.early_data_acceptance = skip_early_data ? PTLS_EARLY_DATA_REJECTED : PTLS_EARLY_DATA_ACCEPTED;
    }
    if ((ret = report_unknown_extensions(tls, properties, unknown_extensions)) != 0)
        goto Exit;

    ptls__key_schedule_update_hash(tls->key_schedule, message.base, message.len);
    tls->state =
        tls->is_psk_handshake ? PTLS_STATE_CLIENT_EXPECT_FINISHED : PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_REQUEST_OR_CERTIFICATE;
    ret = PTLS_ERROR_IN_PROGRESS;

Exit:
    return ret;
}